

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewDocRawNode(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  xmlNodePtr pxVar1;
  xmlNodePtr text;
  xmlNodePtr cur;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlDocPtr doc_local;
  
  doc_local = (xmlDocPtr)xmlNewDocNode(doc,ns,name,(xmlChar *)0x0);
  if ((doc_local != (xmlDocPtr)0x0) && (doc_local->doc = doc, content != (xmlChar *)0x0)) {
    pxVar1 = xmlNewDocText(doc,content);
    if (pxVar1 == (xmlNodePtr)0x0) {
      xmlFreeNode((xmlNodePtr)doc_local);
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local->children = pxVar1;
      doc_local->last = pxVar1;
      pxVar1->parent = (_xmlNode *)doc_local;
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlNewDocRawNode(xmlDocPtr doc, xmlNsPtr ns,
                 const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    cur = xmlNewDocNode(doc, ns, name, NULL);
    if (cur != NULL) {
        cur->doc = doc;
	if (content != NULL) {
            xmlNodePtr text;

	    text = xmlNewDocText(doc, content);
            if (text == NULL) {
                xmlFreeNode(cur);
                return(NULL);
            }

            cur->children = text;
            cur->last = text;
            text->parent = cur;
	}
    }
    return(cur);
}